

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void __thiscall IrSim::optimizeAssign(IrSim *this)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pIVar4;
  pointer pcVar5;
  _Alloc_hider _Var6;
  size_t __n;
  undefined1 *__s2;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  Operand *pOVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  InterCode *pIVar16;
  int n;
  int iVar17;
  long lVar18;
  string val;
  string right;
  undefined1 *local_88;
  size_t local_80;
  undefined1 local_78 [16];
  long local_68;
  long local_60;
  pointer local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->isOpted = false;
  uVar13 = (int)((long)(this->edges).
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->edges).
                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55555555;
  if (0 < (int)uVar13) {
    uVar14 = 0;
    do {
      piVar3 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar3[uVar14];
      lVar18 = (long)iVar1;
      iVar2 = piVar3[uVar14 + 1];
      if (iVar1 < iVar2) {
        do {
          pIVar4 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar1 = pIVar4[lVar18].kind;
          pIVar16 = pIVar4 + lVar18;
          lVar12 = lVar18;
          if (iVar1 == 5) {
            uVar15 = 0xffffffff;
            if (*(pIVar16->target).value._M_dataplus._M_p != 'v') {
              uVar15 = (pIVar16->target).active;
            }
            if (0 < (int)uVar15) {
              pcVar5 = (pIVar16->target).value._M_dataplus._M_p;
              local_88 = local_78;
              local_68 = lVar18;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,pcVar5,
                         pcVar5 + (pIVar16->target).value._M_string_length);
              pIVar4 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              _Var6._M_p = pIVar4[lVar18].arg1.value._M_dataplus._M_p;
              local_50[0] = local_40;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_50,_Var6._M_p,
                         _Var6._M_p + pIVar4[lVar18].arg1.value._M_string_length);
              iVar1 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar18].arg1.kind;
              do {
                sVar7 = local_80;
                __s2 = local_88;
                uVar10 = (ulong)uVar15;
                pIVar4 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                local_60 = uVar10 * 0x98;
                local_58 = pIVar4 + uVar10;
                iVar17 = 0;
                do {
                  pOVar11 = &pIVar4[uVar10].arg1;
                  if ((iVar17 != 1) && (pOVar11 = &pIVar4[uVar10].arg2, iVar17 != 2)) {
                    pOVar11 = &pIVar4[uVar10].target;
                  }
                  __n = (pOVar11->value)._M_string_length;
                  if ((__n == sVar7) &&
                     ((__n == 0 ||
                      (iVar9 = bcmp((pOVar11->value)._M_dataplus._M_p,__s2,__n), iVar9 == 0)))) {
                    this->isOpted = true;
                    lVar12 = 8;
                    if (iVar17 == 2) {
                      lVar12 = 0x68;
                    }
                    if (iVar17 == 1) {
                      lVar12 = 0x38;
                    }
                    std::__cxx11::string::_M_assign
                              ((string *)((long)&(local_58->target).kind + lVar12));
                    pIVar16 = (InterCode *)
                              ((long)&((this->irList).
                                       super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->kind + local_60);
                    lVar12 = 8;
                    if (iVar17 == 2) {
                      lVar12 = 0x68;
                    }
                    if (iVar17 == 1) {
                      lVar12 = 0x38;
                    }
                    *(int *)((long)&pIVar16->kind + lVar12) = iVar1;
                    uVar15 = *(uint *)((long)&(pIVar16->target).value.field_2 + lVar12 + 8);
                    InterCode::doArith(pIVar16);
                    lVar12 = 8;
                    if (iVar17 == 2) {
                      lVar12 = 0x68;
                    }
                    if (iVar17 == 1) {
                      lVar12 = 0x38;
                    }
                    *(undefined4 *)
                     ((long)&(this->irList).
                             super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar15].target.value.field_2 +
                     lVar12 + 8U) = 0;
                    if (iVar17 == 3) {
                      uVar15 = 0xffffffff;
                    }
                    goto LAB_0010a9ef;
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 != 3);
                uVar15 = 0xffffffff;
LAB_0010a9ef:
              } while (0 < (int)uVar15);
              if (local_50[0] != local_40) {
                operator_delete(local_50[0]);
              }
              lVar12 = local_68;
              if (local_88 != local_78) {
                operator_delete(local_88);
              }
            }
            if ((uVar15 == 0) &&
               (bVar8 = canDisable(this,&(this->irList).
                                         super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                                         _M_impl.super__Vector_impl_data._M_start[lVar18].target.
                                         value,(int)uVar14), bVar8)) {
              pIVar4 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pIVar4[lVar18].kind = 0;
              pIVar4[lVar18].target.kind = 0;
              pIVar4[lVar18].target.value._M_string_length = 0;
              *pIVar4[lVar18].target.value._M_dataplus._M_p = '\0';
              pIVar4[lVar18].arg1.kind = 0;
              pIVar4[lVar18].arg1.value._M_string_length = 0;
              *pIVar4[lVar18].arg1.value._M_dataplus._M_p = '\0';
              pIVar4[lVar18].arg2.kind = 0;
              pIVar4[lVar18].arg2.value._M_string_length = 0;
              *pIVar4[lVar18].arg2.value._M_dataplus._M_p = '\0';
              lVar18 = lVar12;
LAB_0010aaa5:
              this->isOpted = true;
              lVar12 = lVar18;
            }
          }
          else if ((iVar1 - 1U < 5) && (bVar8 = InterCode::doArith(pIVar16), bVar8))
          goto LAB_0010aaa5;
          lVar18 = lVar12 + 1;
        } while (iVar2 != (int)lVar18);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uVar13 & 0x7fffffff));
  }
  return;
}

Assistant:

void IrSim::optimizeAssign() {
    isOpted = false;
    int size = (int)edges.size();
    for (int i = 0; i < size; ++i) {
        for (int k = (int) basicBlocks[i], j = (int) basicBlocks[i + 1] - 1; k <= j; ++k) {
            int kind = irList[k].kind;
            if (kind == IC_ASSIGN) {
                int m = irList[k].target.active;
                if (irList[k].target.value[0] == 'v')
                    m = -1;
                if (m > 0) {
                    string val = irList[k].target.value;
                    string right = irList[k].arg1.value;
                    kind = irList[k].arg1.kind;
                    while (m > 0) {
                        int n = 0;
                        for (; n < 3; ++n) {
                            if (irList[m][n].value == val) {
                                isOpted = true;
                                irList[m][n].value = right;
                                irList[m][n].kind = kind;
                                int active = irList[m][n].active;
                                irList[m].doArith();
                                m = active;
                                irList[m][n].active = 0;
                                break;
                            }
                        }
                        if (n == 3) {
//                            cerr << "debug: index val != val (should not happen, ignore optimizing)" << endl;
                            m = -1;
                        }
                    }
                }
//                else if (irList[k].target.active != 0 && irList[k].target.value[0] != 'v') {
//                    cerr << "debug: target < 0 (should not happen, ignore optimizing)" << endl;
//                }
                if (m == 0 && canDisable(irList[k].target.value, i)) {
                    irList[k].disable();
                    isOpted = true;
                }
            }
            else if (kind >= IC_ADD && kind <= IC_ASSIGN) {
                if (irList[k].doArith())
                    isOpted = true;
            }
        }
    }
}